

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.h
# Opt level: O2

void __thiscall Assimp::Vertex::Vertex(Vertex *this,aiMesh *msh,uint idx)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  aiVector3D *paVar3;
  long lVar4;
  undefined8 uVar5;
  float fVar6;
  bool bVar7;
  aiVector3D *paVar8;
  uint i;
  long lVar9;
  ulong uVar10;
  
  memset(this,0,0x110);
  if (idx < msh->mNumVertices) {
    paVar8 = msh->mVertices;
    uVar10 = (ulong)idx;
    (this->position).z = paVar8[uVar10].z;
    paVar8 = paVar8 + uVar10;
    fVar6 = paVar8->y;
    (this->position).x = paVar8->x;
    (this->position).y = fVar6;
    paVar8 = msh->mNormals;
    if ((paVar8 != (aiVector3D *)0x0) && (msh->mNumVertices != 0)) {
      (this->normal).z = paVar8[uVar10].z;
      fVar6 = paVar8[uVar10].y;
      (this->normal).x = paVar8[uVar10].x;
      (this->normal).y = fVar6;
    }
    bVar7 = aiMesh::HasTangentsAndBitangents(msh);
    if (bVar7) {
      paVar8 = msh->mTangents;
      (this->tangent).z = paVar8[uVar10].z;
      paVar8 = paVar8 + uVar10;
      fVar6 = paVar8->y;
      (this->tangent).x = paVar8->x;
      (this->tangent).y = fVar6;
      paVar8 = msh->mBitangents;
      (this->bitangent).z = paVar8[uVar10].z;
      paVar8 = paVar8 + uVar10;
      fVar6 = paVar8->y;
      (this->bitangent).x = paVar8->x;
      (this->bitangent).y = fVar6;
    }
    paVar8 = this->texcoords;
    lVar9 = 0;
    while (((lVar9 != 8 && (paVar3 = msh->mTextureCoords[lVar9], paVar3 != (aiVector3D *)0x0)) &&
           (msh->mNumVertices != 0))) {
      paVar8->z = paVar3[uVar10].z;
      fVar6 = paVar3[uVar10].y;
      paVar8->x = paVar3[uVar10].x;
      paVar8->y = fVar6;
      lVar9 = lVar9 + 1;
      paVar8 = paVar8 + 1;
    }
    lVar9 = 0;
    while (((lVar9 != 0x40 && (lVar4 = *(long *)((long)msh->mColors + lVar9), lVar4 != 0)) &&
           (msh->mNumVertices != 0))) {
      puVar1 = (undefined8 *)(lVar4 + uVar10 * 0x10);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)&this->colors[0].r + lVar9 * 2);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      lVar9 = lVar9 + 8;
    }
    return;
  }
  __assert_fail("idx < msh->mNumVertices",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/Vertex.h"
                ,0x71,"Assimp::Vertex::Vertex(const aiMesh *, unsigned int)");
}

Assistant:

explicit Vertex(const aiMesh* msh, unsigned int idx) {
        ai_assert(idx < msh->mNumVertices);
        position = msh->mVertices[idx];

        if (msh->HasNormals()) {
            normal = msh->mNormals[idx];
        }

        if (msh->HasTangentsAndBitangents()) {
            tangent = msh->mTangents[idx];
            bitangent = msh->mBitangents[idx];
        }

        for (unsigned int i = 0; msh->HasTextureCoords(i); ++i) {
            texcoords[i] = msh->mTextureCoords[i][idx];
        }

        for (unsigned int i = 0; msh->HasVertexColors(i); ++i) {
            colors[i] = msh->mColors[i][idx];
        }
    }